

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerPoll.cpp
# Opt level: O1

void __thiscall Liby::PollerPoll::addChanel(PollerPoll *this,Channel *ch)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  pointer ppVar4;
  ulong uVar5;
  
  if (ch != (Channel *)0x0) {
    uVar3 = ch->fd_;
    uVar5 = (ulong)uVar3;
    if (-1 < (int)uVar3) {
      bVar1 = ch->readable_;
      bVar2 = ch->writable_;
      if ((ulong)((long)(this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)(this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl
                        .super__Vector_impl_data._M_start >> 3) <= uVar5) {
        std::vector<pollfd,_std::allocator<pollfd>_>::resize(&this->pollfds_,uVar5 * 2 + 1);
      }
      ppVar4 = (this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start;
      ppVar4[uVar5].fd = uVar3;
      ppVar4[uVar5].events = (ushort)bVar1 + (ushort)bVar2 * 4 + 0x2008;
      (this->super_Poller).channels_.
      super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = ch;
      return;
    }
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerPoll.cpp"
                ,9,"virtual void Liby::PollerPoll::addChanel(Channel *)");
}

Assistant:

void PollerPoll::addChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();

    struct pollfd pollfd1;
    pollfd1.fd = fd;
#ifdef __linux__
    pollfd1.events = POLLRDHUP | POLLERR;
#elif defined(__APPLE__)
    pollfd1.events = POLLERR | POLLHUP;
#endif
    if (ch->readable())
        pollfd1.events |= POLLIN;
    if (ch->writable())
        pollfd1.events |= POLLOUT;

    if (pollfds_.size() <= static_cast<decltype(pollfds_.size())>(fd))
        pollfds_.resize(fd * 2 + 1);

    pollfds_[fd] = pollfd1;
    setChannel(fd, ch);
}